

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linker.cpp
# Opt level: O1

bool __thiscall Linker::SaveRegVmListing(Linker *this,OutputContext *output,bool withProfileInfo)

{
  byte bVar1;
  uchar rA;
  uchar rB;
  uchar rC;
  RegVmCmd *pRVar2;
  uint *puVar3;
  OutputContext *pOVar4;
  uint i;
  uint uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ExternFuncInfo **ppEVar10;
  char *pcVar11;
  ExternFuncInfo *pEVar12;
  undefined7 in_register_00000011;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ExternSourceInfo *pEVar16;
  uint i_1;
  byte *pbVar17;
  byte *pbVar18;
  ulong uVar19;
  byte *pbVar20;
  bool bVar21;
  ExternFuncInfo *local_360;
  uint local_354;
  OutputContext *local_350;
  undefined4 local_344;
  ulong local_340;
  byte *local_338;
  ulong local_330;
  uint local_324;
  ulong local_320;
  ExternSourceInfo *local_318;
  ExternSourceInfo *local_310;
  double local_308;
  double dStack_300;
  TraceScope traceScope;
  SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U> regVmJumpTargetSet;
  SmallDenseMap<unsigned_int,_ExternFuncInfo_*,_SmallDenseMapUnsignedHasher,_32U> regVmFunctionMap;
  
  local_350 = output;
  if ((SaveRegVmListing(OutputContext&,bool)::token == '\0') &&
     (iVar7 = __cxa_guard_acquire(&SaveRegVmListing(OutputContext&,bool)::token), iVar7 != 0)) {
    SaveRegVmListing::token = NULLC::TraceGetToken("link","SaveRegVmListing");
    __cxa_guard_release(&SaveRegVmListing(OutputContext&,bool)::token);
  }
  NULLC::TraceScope::TraceScope(&traceScope,SaveRegVmListing::token);
  if (withProfileInfo) {
    lVar8 = 0;
    local_320 = 0;
    do {
      local_320 = local_320 + (this->exRegVmInstructionExecCount).data[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x100);
  }
  else {
    local_320 = 0;
  }
  local_318 = (this->exRegVmSourceInfo).data;
  local_330 = (ulong)(this->exRegVmSourceInfo).count;
  regVmJumpTargetSet.data = regVmJumpTargetSet.storage;
  regVmJumpTargetSet.allocator = (Allocator *)0x0;
  regVmJumpTargetSet.bucketCount = 0x20;
  regVmJumpTargetSet.count = 0;
  NULLC::fillMemory(regVmJumpTargetSet.data,0,0x80);
  if ((this->regVmJumpTargets).count != 0) {
    lVar8 = 0;
    uVar19 = 0;
    do {
      SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U>::insert
                (&regVmJumpTargetSet,(uint *)((long)(this->regVmJumpTargets).data + lVar8));
      uVar19 = uVar19 + 1;
      lVar8 = lVar8 + 4;
    } while (uVar19 < (this->regVmJumpTargets).count);
  }
  local_344 = (undefined4)CONCAT71(in_register_00000011,withProfileInfo);
  regVmFunctionMap.data = regVmFunctionMap.storage;
  regVmFunctionMap.allocator = (Allocator *)0x0;
  regVmFunctionMap.bucketCount = 0x20;
  regVmFunctionMap.count = 0;
  NULLC::fillMemory(regVmFunctionMap.data,0,0x200);
  if ((this->exFunctions).count != 0) {
    lVar8 = 0;
    uVar19 = 0;
    do {
      pEVar12 = (this->exFunctions).data;
      local_324 = *(uint *)((long)&pEVar12->regVmAddress + lVar8);
      local_360 = (ExternFuncInfo *)((long)&pEVar12->offsetToName + lVar8);
      SmallDenseMap<unsigned_int,_ExternFuncInfo_*,_SmallDenseMapUnsignedHasher,_32U>::insert
                (&regVmFunctionMap,&local_324,&local_360);
      uVar19 = uVar19 + 1;
      lVar8 = lVar8 + 0x94;
    } while (uVar19 < (this->exFunctions).count);
  }
  local_360 = (ExternFuncInfo *)((ulong)local_360 & 0xffffffff00000000);
  if ((int)local_330 != 0) {
    uVar14 = (int)local_330 - 1;
    dStack_300 = (double)CONCAT44(0x45300000,(int)(local_320 >> 0x20)) - 1.9342813113834067e+25;
    local_308 = dStack_300 + ((double)CONCAT44(0x43300000,(int)local_320) - 4503599627370496.0);
    local_310 = local_318 + 1;
    local_354 = 0xffffffff;
    uVar13 = 0;
    local_338 = (byte *)0x0;
    uVar6 = 0;
    pbVar20 = (byte *)(this->exSource).data;
    do {
      if ((this->exRegVmCode).count <= uVar6) break;
      uVar15 = uVar14;
      if (uVar14 < uVar13) {
        uVar15 = uVar13;
      }
      uVar19 = (ulong)uVar13;
      pEVar16 = local_310 + uVar19;
      uVar5 = uVar13 - 1;
      do {
        uVar13 = uVar15;
        if (uVar14 <= uVar19) break;
        uVar19 = uVar19 + 1;
        uVar13 = uVar5 + 1;
        puVar3 = &pEVar16->instruction;
        pEVar16 = pEVar16 + 1;
        uVar5 = uVar13;
      } while (*puVar3 <= uVar6);
      pbVar18 = pbVar20;
      uVar6 = local_354;
      pbVar17 = local_338;
      if (uVar13 != local_354) {
        pbVar17 = (byte *)(this->exSource).data;
        uVar19 = (ulong)local_318[uVar13].sourceOffset;
        do {
          uVar9 = uVar19;
          if (uVar9 == 0) goto LAB_001bdeab;
          uVar19 = uVar9 - 1;
        } while (pbVar17[uVar9 - 1] != 10);
        pbVar17 = pbVar17 + uVar9;
LAB_001bdeab:
        uVar15 = (int)pbVar17 - (int)pbVar20;
        for (; (*pbVar17 == 9 || (*pbVar17 == 0x20)); pbVar17 = pbVar17 + 1) {
          uVar15 = uVar15 + 1;
        }
        uVar5 = 0;
        pbVar18 = pbVar17;
        while( true ) {
          if ((*pbVar18 < 0xe) && ((0x2401U >> (*pbVar18 & 0x1f) & 1) != 0)) break;
          pbVar18 = pbVar18 + 1;
          uVar5 = uVar5 + 1;
          uVar15 = uVar15 + 1;
        }
        uVar6 = uVar13;
        if (pbVar20 < pbVar18) {
          OutputContext::Printf(local_350,"%.*s\r\n",(ulong)uVar15,pbVar20);
          pbVar17 = local_338;
        }
        else {
          pbVar18 = pbVar20;
          if (pbVar17 != local_338) {
            OutputContext::Printf(local_350,"%.*s\r\n",(ulong)uVar5,pbVar17);
          }
        }
      }
      local_338 = pbVar17;
      local_354 = uVar6;
      uVar19 = (ulong)local_360 & 0xffffffff;
      if ((this->exRegVmCode).count <= (uint)local_360) {
LAB_001be3e6:
        pcVar11 = 
        "T &FastVector<RegVmCmd>::operator[](unsigned int) [T = RegVmCmd, zeroNewMemory = false, skipConstructor = false]"
        ;
LAB_001be3fb:
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x7f,pcVar11);
      }
      if (regVmJumpTargetSet.bucketCount != 0) {
        uVar15 = (uint)local_360 * -0x61c88647 & regVmJumpTargetSet.bucketCount - 1;
        uVar6 = 1;
        do {
          if (regVmJumpTargetSet.data[uVar15] == 0) {
            bVar21 = false;
            pbVar20 = (byte *)0x0;
          }
          else if (regVmJumpTargetSet.data[uVar15] == (uint)local_360) {
            pbVar20 = (byte *)0x1;
            bVar21 = false;
          }
          else {
            uVar15 = uVar15 + uVar6 & regVmJumpTargetSet.bucketCount - 1;
            bVar21 = true;
          }
          if (!bVar21) goto LAB_001bdfbb;
          bVar21 = uVar6 != regVmJumpTargetSet.bucketCount;
          uVar6 = uVar6 + 1;
        } while (bVar21);
      }
      pbVar20 = (byte *)0x0;
LAB_001bdfbb:
      pRVar2 = (this->exRegVmCode).data;
      bVar1 = pRVar2[uVar19].code;
      rA = pRVar2[uVar19].rA;
      rB = pRVar2[uVar19].rB;
      rC = pRVar2[uVar19].rC;
      local_340 = (ulong)pRVar2[uVar19].argument;
      ppEVar10 = SmallDenseMap<unsigned_int,_ExternFuncInfo_*,_SmallDenseMapUnsignedHasher,_32U>::
                 find(&regVmFunctionMap,(uint *)&local_360);
      if (ppEVar10 != (ExternFuncInfo **)0x0) {
        OutputContext::Printf
                  (local_350,"// %s#%d\n",(this->exSymbols).data + (*ppEVar10)->offsetToName,
                   (ulong)(uint)((int)((ulong)((long)*ppEVar10 - (long)(this->exFunctions).data) >>
                                      2) * -0x6eb3e453));
      }
      pOVar4 = local_350;
      uVar19 = (ulong)local_360 & 0xffffffff;
      if ((char)local_344 == '\0') {
        if (((ulong)pbVar20 & 1) == 0) {
          OutputContext::Printf(local_350,"// %4d ",uVar19);
        }
        else {
          OutputContext::Printf(local_350,"// %4d:\n",uVar19);
          OutputContext::Printf(pOVar4,"//      ");
        }
      }
      else if (((ulong)pbVar20 & 1) == 0) {
        if ((this->exRegVmExecCount).count <= (uint)local_360) goto LAB_001be3cf;
        if (((double)(this->exRegVmExecCount).data[uVar19] / local_308) * 100.0 <= 0.1) {
          OutputContext::Printf(local_350,"// (%8d     ) %4d ");
        }
        else {
          OutputContext::Printf(local_350,"// (%8d %4.1f) %4d ");
        }
      }
      else {
        OutputContext::Printf(local_350,"//            %4d:\n",(ulong)local_360 & 0xffffffff);
        if ((this->exRegVmExecCount).count <= (uint)local_360) {
LAB_001be3cf:
          pcVar11 = 
          "T &FastVector<unsigned int>::operator[](unsigned int) [T = unsigned int, zeroNewMemory = false, skipConstructor = false]"
          ;
          goto LAB_001be3fb;
        }
        if (((double)(this->exRegVmExecCount).data[(ulong)local_360 & 0xffffffff] / local_308) *
            100.0 <= 0.1) {
          OutputContext::Printf(pOVar4,"// (%8d     )      ");
        }
        else {
          OutputContext::Printf(pOVar4,"// (%8d %4.1f)      ");
        }
      }
      PrintInstruction(pOVar4,(char *)(this->exRegVmConstants).data,(this->exFunctions).data,
                       (this->exSymbols).data,(uint)bVar1,rA,rB,rC,(uint)local_340,(VmConstant *)0x0
                      );
      if (bVar1 == 0x5f) {
LAB_001be1c3:
        if ((this->exRegVmCode).count <= (uint)local_360) goto LAB_001be3e6;
        uVar6 = (this->exRegVmCode).data[(ulong)local_360 & 0xffffffff].argument;
        if ((this->exFunctions).count <= uVar6) {
          pcVar11 = 
          "T &FastVector<ExternFuncInfo>::operator[](unsigned int) [T = ExternFuncInfo, zeroNewMemory = false, skipConstructor = false]"
          ;
          goto LAB_001be3fb;
        }
        pcVar11 = (this->exSymbols).data;
        pEVar12 = (this->exFunctions).data + uVar6;
LAB_001be242:
        OutputContext::Printf(pOVar4," (%s)",pcVar11 + pEVar12->offsetToName);
      }
      else {
        if (bVar1 == 0x5e) {
          if ((this->exRegVmCode).count <= (uint)local_360) goto LAB_001be3e6;
          uVar6 = (this->exRegVmCode).data[(ulong)local_360 & 0xffffffff].argument;
          if ((this->exTypes).count <= uVar6) {
            pcVar11 = 
            "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
            ;
            goto LAB_001be3fb;
          }
          pcVar11 = (this->exSymbols).data;
          pEVar12 = (ExternFuncInfo *)((this->exTypes).data + uVar6);
          goto LAB_001be242;
        }
        if (bVar1 == 0x20) goto LAB_001be1c3;
      }
      OutputContext::Printf(pOVar4,"\n");
      uVar6 = (uint)local_360 + 1;
      local_360 = (ExternFuncInfo *)CONCAT44(local_360._4_4_,uVar6);
      pbVar20 = pbVar18;
    } while ((int)local_330 != 0);
  }
  pOVar4 = local_350;
  if ((char)local_344 != '\0') {
    OutputContext::Printf(local_350,"\n");
    uVar19 = local_320;
    local_340 = CONCAT44(local_340._4_4_,(float)local_320);
    lVar8 = 0;
    do {
      uVar13 = (this->exRegVmInstructionExecCount).data[lVar8];
      if (uVar13 != 0) {
        pcVar11 = GetInstructionName((RegVmInstructionCode)lVar8);
        OutputContext::Printf
                  (pOVar4,"// %9s: %10d (%4.1f%%)\n",
                   (double)((float)uVar13 / (float)local_340) * 100.0,pcVar11,(ulong)uVar13);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x100);
    OutputContext::Printf(pOVar4,"// %9s: %10lld (%4.0f%%)\n",0x4059000000000000,"total",uVar19);
  }
  if (pOVar4->outputBufPos != 0) {
    (*pOVar4->writeStream)(pOVar4->stream,pOVar4->outputBuf,pOVar4->outputBufPos);
  }
  pOVar4->outputBufPos = 0;
  SmallDenseMap<unsigned_int,_ExternFuncInfo_*,_SmallDenseMapUnsignedHasher,_32U>::~SmallDenseMap
            (&regVmFunctionMap);
  SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U>::~SmallDenseSet(&regVmJumpTargetSet)
  ;
  NULLC::TraceScope::~TraceScope(&traceScope);
  return true;
}

Assistant:

bool Linker::SaveRegVmListing(OutputContext &output, bool withProfileInfo)
{
	TRACE_SCOPE("link", "SaveRegVmListing");

	unsigned line = 0, lastLine = ~0u;

	unsigned long long total = 0;

	if(withProfileInfo)
	{
		for(unsigned i = 0; i < 256; i++)
			total += exRegVmInstructionExecCount[i];
	}

	ExternSourceInfo *info = (ExternSourceInfo*)exRegVmSourceInfo.data;
	unsigned infoSize = exRegVmSourceInfo.size();

	SmallDenseSet<unsigned, SmallDenseMapUnsignedHasher, 32> regVmJumpTargetSet;

	for(unsigned i = 0; i < regVmJumpTargets.size(); i++)
		regVmJumpTargetSet.insert(regVmJumpTargets[i]);

	SmallDenseMap<unsigned, ExternFuncInfo*, SmallDenseMapUnsignedHasher, 32> regVmFunctionMap;

	for(unsigned i = 0; i < exFunctions.size(); i++)
		regVmFunctionMap.insert(exFunctions[i].regVmAddress, &exFunctions[i]);

	const char *lastSourcePos = exSource.data;
	const char *lastCodeStart = NULL;

	for(unsigned i = 0; infoSize && i < exRegVmCode.size(); i++)
	{
		while((line < infoSize - 1) && (i >= info[line + 1].instruction))
			line++;

		if(line != lastLine)
		{
			lastLine = line;

			const char *codeStart = exSource.data + info[line].sourceOffset;

			// Find beginning of the line
			while(codeStart != exSource.data && *(codeStart-1) != '\n')
				codeStart--;

			// Skip whitespace
			while(*codeStart == ' ' || *codeStart == '\t')
				codeStart++;

			const char *codeEnd = codeStart;
			while(*codeEnd != '\0' && *codeEnd != '\r' && *codeEnd != '\n')
				codeEnd++;

			if(codeEnd > lastSourcePos)
			{
				output.Printf("%.*s\r\n", int(codeEnd - lastSourcePos), lastSourcePos);
				lastSourcePos = codeEnd;
			}
			else
			{
				if(codeStart != lastCodeStart)
					output.Printf("%.*s\r\n", int(codeEnd - codeStart), codeStart);

				lastCodeStart = codeStart;
			}
		}

		RegVmCmd cmd = exRegVmCode[i];

		bool found = regVmJumpTargetSet.contains(i);

		if(ExternFuncInfo **func = regVmFunctionMap.find(i))
			output.Printf("// %s#%d\n", exSymbols.data + (*func)->offsetToName, unsigned(*func - exFunctions.data));

		if(withProfileInfo)
		{
			if(found)
			{
				output.Printf("//            %4d:\n", i);

				double percent = double(exRegVmExecCount[i]) / total * 100.0;

				if(percent > 0.1)
					output.Printf("// (%8d %4.1f)      ", exRegVmExecCount[i], percent);
				else
					output.Printf("// (%8d     )      ", exRegVmExecCount[i]);
			}
			else
			{
				double percent = double(exRegVmExecCount[i]) / total * 100.0;

				if(percent > 0.1)
					output.Printf("// (%8d %4.1f) %4d ", exRegVmExecCount[i], percent, i);
				else
					output.Printf("// (%8d     ) %4d ", exRegVmExecCount[i], i);
			}
		}
		else
		{
			if(found)
			{
				output.Printf("// %4d:\n", i);
				output.Printf("//      ");
			}
			else
			{
				output.Printf("// %4d ", i);
			}
		}

		PrintInstruction(output, (char*)exRegVmConstants.data, exFunctions.data, exSymbols.data, RegVmInstructionCode(cmd.code), cmd.rA, cmd.rB, cmd.rC, cmd.argument, NULL);

		if(cmd.code == rviCall || cmd.code == rviFuncAddr)
			output.Printf(" (%s)", exSymbols.data + exFunctions[exRegVmCode[i].argument].offsetToName);
		else if(cmd.code == rviConvertPtr)
			output.Printf(" (%s)", exSymbols.data + exTypes[exRegVmCode[i].argument].offsetToName);

		output.Printf("\n");
	}

	if(withProfileInfo)
	{
		output.Printf("\n");

		for(unsigned i = 0; i < 256; i++)
		{
			if(unsigned count = exRegVmInstructionExecCount[i])
				output.Printf("// %9s: %10d (%4.1f%%)\n", GetInstructionName(RegVmInstructionCode(i)), count, float(count) / total * 100.0);
		}

		output.Printf("// %9s: %10lld (%4.0f%%)\n", "total", total, 100.0);
	}

	output.Flush();

	return true;
}